

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execShiftRg<(moira::Core)2,(moira::Instr)96,(moira::Mode)0,2>(Moira *this,u16 opcode)

{
  u32 uVar1;
  uint cnt;
  
  this->cp = 0;
  cnt = *(uint *)((long)&(this->reg).field_3 + (ulong)(opcode >> 9 & 7) * 4) & 0x3f;
  uVar1 = (this->reg).pc;
  (this->reg).pc0 = uVar1;
  (this->queue).ird = (this->queue).irc;
  uVar1 = read<(moira::Core)2,(moira::AddrSpace)2,2,4ull>(this,uVar1 + 2);
  (this->queue).irc = (u16)uVar1;
  this->readBuffer = (u16)uVar1;
  uVar1 = shift<(moira::Core)2,(moira::Instr)96,2>
                    (this,cnt,(ulong)*(ushort *)
                                      ((long)&(this->reg).field_3 + (ulong)(opcode & 7) * 4));
  *(short *)((long)&(this->reg).field_3 + (ulong)(opcode & 7) * 4) = (short)uVar1;
  (*this->_vptr_Moira[2])(this,(ulong)(cnt + this->cp + 0xc));
  return;
}

Assistant:

void
Moira::execShiftRg(u16 opcode)
{
    AVAILABILITY(Core::C68000)

    int src = ____xxx_________(opcode);
    int dst = _____________xxx(opcode);

    int cnt = readD(src) & 0x3F;
    int cyc = (S == Long ? 4 : 2) + 2 * cnt;

    prefetch<C, POLL>();
    SYNC(cyc);

    writeD<S>(dst, shift<C, I, S>(cnt, readD<S>(dst)));

    if constexpr (C == Core::C68000 || C == Core::C68010) {

        CYCLES(4 + cyc);

    } else {

        switch (I) {

            case Instr::ROL:
            case Instr::ROR:
            case Instr::ASL:
                
                CYCLES(  8 + cnt );
                break;
                
            case Instr::ROXL:
            case Instr::ROXR:
                
                CYCLES( 12 + cnt );
                break;
                
            default:
                
                CYCLES(  6 + cnt );
                break;
        }
    }

    FINALIZE
}